

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptGeneratorFunction.cpp
# Opt level: O0

void __thiscall
Js::JavascriptGeneratorFunction::CreateSnapObjectInfo
          (JavascriptGeneratorFunction *this,SlabAllocator *alloc,SnapGeneratorFunctionInfo **info,
          TTD_PTR_ID **depArray,uint32 *depCount)

{
  byte bVar1;
  bool bVar2;
  SnapGeneratorFunctionInfo *pSVar3;
  GeneratorVirtualScriptFunction **ppGVar4;
  GeneratorVirtualScriptFunction *pGVar5;
  unsigned_long *puVar6;
  uint32 *depCount_local;
  TTD_PTR_ID **depArray_local;
  SnapGeneratorFunctionInfo **info_local;
  SlabAllocator *alloc_local;
  JavascriptGeneratorFunction *this_local;
  
  pSVar3 = TTD::SlabAllocatorBase<0>::
           SlabAllocateStruct<TTD::NSSnapObjects::SnapGeneratorFunctionInfo>(alloc);
  *info = pSVar3;
  ppGVar4 = Memory::PointerValue<Js::GeneratorVirtualScriptFunction>(&this->scriptFunction);
  (*info)->scriptFunction = (TTD_PTR_ID)*ppGVar4;
  pGVar5 = Memory::WriteBarrierPtr<Js::GeneratorVirtualScriptFunction>::operator->
                     (&this->scriptFunction);
  bVar1 = (**(code **)((long)(pGVar5->super_ScriptFunction).super_ScriptFunctionBase.
                             super_JavascriptFunction.super_DynamicObject.super_RecyclableObject.
                             super_FinalizableObject.super_IRecyclerVisitedObject + 0x3b8))();
  (*info)->isAnonymousFunction = (bool)(bVar1 & 1);
  *depCount = 0;
  *depArray = (TTD_PTR_ID *)0x0;
  ppGVar4 = Memory::WriteBarrierPtr::operator_cast_to_GeneratorVirtualScriptFunction__
                      ((WriteBarrierPtr *)&this->scriptFunction);
  if (*ppGVar4 != (GeneratorVirtualScriptFunction *)0x0) {
    ppGVar4 = Memory::WriteBarrierPtr::operator_cast_to_GeneratorVirtualScriptFunction__
                        ((WriteBarrierPtr *)&this->scriptFunction);
    bVar2 = TTD::JsSupport::IsVarComplexKind(*ppGVar4);
    if (bVar2) {
      puVar6 = TTD::SlabAllocatorBase<0>::SlabReserveArraySpace<unsigned_long>(alloc,1);
      *depArray = puVar6;
      ppGVar4 = Memory::PointerValue<Js::GeneratorVirtualScriptFunction>(&this->scriptFunction);
      (*depArray)[*depCount] = (TTD_PTR_ID)*ppGVar4;
      *depCount = 1;
      TTD::SlabAllocatorBase<0>::SlabCommitArraySpace<unsigned_long>(alloc,(ulong)*depCount,1);
    }
  }
  return;
}

Assistant:

void JavascriptGeneratorFunction::CreateSnapObjectInfo(TTD::SlabAllocator& alloc, _Out_ TTD::NSSnapObjects::SnapGeneratorFunctionInfo** info, _Out_ TTD_PTR_ID** depArray, _Out_ uint32* depCount)
    {
        *info = alloc.SlabAllocateStruct<TTD::NSSnapObjects::SnapGeneratorFunctionInfo>();
        (*info)->scriptFunction = TTD_CONVERT_VAR_TO_PTR_ID(this->scriptFunction);
        (*info)->isAnonymousFunction = this->scriptFunction->IsAnonymousFunction();

        *depCount = 0;
        *depArray = nullptr;
        if (this->scriptFunction != nullptr &&  TTD::JsSupport::IsVarComplexKind(this->scriptFunction))
        {
            *depArray = alloc.SlabReserveArraySpace<TTD_PTR_ID>(1);
            (*depArray)[*depCount] = TTD_CONVERT_VAR_TO_PTR_ID(this->scriptFunction);
            *depCount = 1;
            alloc.SlabCommitArraySpace<TTD_PTR_ID>(*depCount, 1);
        }
    }